

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferStream.hh
# Opt level: O0

void __thiscall avro::ostream::~ostream(ostream *this,void **vtt)

{
  ostreambuf *in_RSI;
  long *in_RDI;
  
  *in_RDI = *(long *)in_RSI;
  *(undefined8 *)((long)in_RDI + *(long *)(*in_RDI + -0x18)) = *(undefined8 *)&in_RSI->field_0x18;
  ostreambuf::~ostreambuf(in_RSI);
  std::ostream::~ostream(in_RDI);
  return;
}

Assistant:

class AVRO_DECL ostream : public std::ostream {

  public:

    /// Default constructor, creates a new OutputBuffer.
    ostream() : 
        std::ostream(&obuf_) 
    { }

    /// Output to a specific buffer.
    ostream(OutputBuffer &buf) : 
        std::ostream(&obuf_),
        obuf_(buf)
    { }

    /// Return the output buffer created by the write operations to this ostream.
    const OutputBuffer &getBuffer() const {
        return obuf_.getBuffer();
    }

  protected:

    ostreambuf obuf_;
}